

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O0

Program __thiscall
soul::Compiler::build(Compiler *this,CompileMessageList *messageList,BuildBundle *bundle)

{
  uint64_t this_00;
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  CodeLocation *pCVar4;
  vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *this_01;
  RefCountedPtr<soul::Program::ProgramImpl> extraout_RDX;
  Program PVar5;
  CodeLocation local_1b8;
  reference local_1a8;
  SourceFile *file_1;
  const_iterator __end1;
  const_iterator __begin1;
  SourceFiles *__range1;
  reference local_178;
  SourceFile *file;
  const_iterator __end2;
  const_iterator __begin2;
  SourceFiles *__range2;
  Compiler c;
  CodeLocation local_e0 [2];
  CompileMessage local_c0;
  CodeLocation local_88;
  undefined1 local_78 [8];
  ArrayWithPreallocation<soul::CodeLocation,_4UL> heartFiles;
  BuildBundle *bundle_local;
  CompileMessageList *messageList_local;
  
  heartFiles.space[7] = (uint64_t)bundle;
  sanityCheckBuildSettings(&bundle->settings,1,0x10000);
  getHEARTFiles((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_78,
                (BuildBundle *)heartFiles.space[7]);
  bVar1 = ArrayWithPreallocation<soul::CodeLocation,_4UL>::empty
                    ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_78);
  if (bVar1) {
    bVar1 = std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::empty
                      ((vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)
                       (heartFiles.space[7] + 0x60));
    Compiler((Compiler *)&__range2,bVar1);
    bVar1 = std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::empty
                      ((vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)
                       (heartFiles.space[7] + 0x60));
    if (!bVar1) {
      this_01 = (vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)
                (heartFiles.space[7] + 0x60);
      __end2 = std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::begin(this_01);
      file = (SourceFile *)
             std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_soul::SourceFile_*,_std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>_>
                                         *)&file), bVar1) {
        local_178 = __gnu_cxx::
                    __normal_iterator<const_soul::SourceFile_*,_std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>_>
                    ::operator*(&__end2);
        CodeLocation::createFromSourceFile((CodeLocation *)&__range1,local_178);
        bVar1 = addCode((Compiler *)&__range2,messageList,(CodeLocation *)&__range1);
        CodeLocation::~CodeLocation((CodeLocation *)&__range1);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          Program::Program((Program *)this);
          goto LAB_0031755a;
        }
        __gnu_cxx::
        __normal_iterator<const_soul::SourceFile_*,_std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>_>
        ::operator++(&__end2);
      }
    }
    this_00 = heartFiles.space[7];
    __end1 = std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::begin
                       ((vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)
                        heartFiles.space[7]);
    file_1 = (SourceFile *)
             std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::end
                       ((vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_soul::SourceFile_*,_std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>_>
                                       *)&file_1), bVar1) {
      local_1a8 = __gnu_cxx::
                  __normal_iterator<const_soul::SourceFile_*,_std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>_>
                  ::operator*(&__end1);
      CodeLocation::createFromSourceFile(&local_1b8,local_1a8);
      bVar1 = addCode((Compiler *)&__range2,messageList,&local_1b8);
      CodeLocation::~CodeLocation(&local_1b8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        Program::Program((Program *)this);
        goto LAB_0031755a;
      }
      __gnu_cxx::
      __normal_iterator<const_soul::SourceFile_*,_std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>_>
      ::operator++(&__end1);
    }
    link(this,(char *)&__range2,(char *)messageList);
LAB_0031755a:
    c._108_4_ = 1;
    ~Compiler((Compiler *)&__range2);
LAB_00317576:
    ArrayWithPreallocation<soul::CodeLocation,_4UL>::~ArrayWithPreallocation
              ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_78);
    PVar5.refHolder.object = extraout_RDX.object;
    PVar5.pimpl = (ProgramImpl *)this;
    return PVar5;
  }
  sVar2 = ArrayWithPreallocation<soul::CodeLocation,_4UL>::size
                    ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_78);
  if (sVar2 < 2) {
    sVar2 = ArrayWithPreallocation<soul::CodeLocation,_4UL>::size
                      ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_78);
    sVar3 = std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::size
                      ((vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)
                       heartFiles.space[7]);
    if (sVar3 <= sVar2) {
      pCVar4 = ArrayWithPreallocation<soul::CodeLocation,_4UL>::front
                         ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_78);
      CodeLocation::CodeLocation(local_e0,pCVar4);
      buildHEART((soul *)this,messageList,local_e0);
      CodeLocation::~CodeLocation(local_e0);
      c._108_4_ = 1;
      goto LAB_00317576;
    }
  }
  local_88.sourceCode.object = (SourceCodeText *)0x0;
  local_88.location.data = (char *)0x0;
  CodeLocation::CodeLocation(&local_88);
  Errors::onlyOneHeartFileAllowed<>();
  CodeLocation::throwError(&local_88,&local_c0);
}

Assistant:

Program Compiler::build (CompileMessageList& messageList, const BuildBundle& bundle)
{
    sanityCheckBuildSettings (bundle.settings);

    auto heartFiles = getHEARTFiles (bundle);

    if (! heartFiles.empty())
    {
        if (heartFiles.size() > 1 || heartFiles.size() < bundle.sourceFiles.size())
            CodeLocation().throwError (Errors::onlyOneHeartFileAllowed());

        return buildHEART (messageList, heartFiles.front());
    }

    Compiler c (bundle.settings.overrideStandardLibrary.empty());

    if (! bundle.settings.overrideStandardLibrary.empty())
        for (auto& file : bundle.settings.overrideStandardLibrary)
            if (! c.addCode (messageList, CodeLocation::createFromSourceFile (file)))
                return {};

    for (auto& file : bundle.sourceFiles)
        if (! c.addCode (messageList, CodeLocation::createFromSourceFile (file)))
            return {};

    return c.link (messageList, bundle.settings);
}